

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O3

void __thiscall
duckdb::WriteAheadLogDeserializer::ReplayCreateMacro(WriteAheadLogDeserializer *this)

{
  BinaryDeserializer *deserializer;
  ClientContext *context;
  Catalog *this_00;
  int iVar1;
  CreateFunctionInfo *info;
  pointer *__ptr;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> ptr;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_28;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_20;
  
  deserializer = &this->deserializer;
  (*(this->deserializer).super_Deserializer._vptr_Deserializer[2])(deserializer,0x65,"macro");
  local_28._M_head_impl = (CreateInfo *)0x0;
  iVar1 = (*(this->deserializer).super_Deserializer._vptr_Deserializer[10])(deserializer);
  if ((char)iVar1 == '\0') {
    local_20._M_head_impl = (CreateInfo *)0x0;
  }
  else {
    (*(deserializer->super_Deserializer)._vptr_Deserializer[6])(deserializer);
    CreateInfo::Deserialize
              ((CreateInfo *)&stack0xffffffffffffffe0,&deserializer->super_Deserializer);
    local_28._M_head_impl = local_20._M_head_impl;
    (*(deserializer->super_Deserializer)._vptr_Deserializer[7])(deserializer);
  }
  (*(deserializer->super_Deserializer)._vptr_Deserializer[0xb])(deserializer);
  (*(deserializer->super_Deserializer)._vptr_Deserializer[3])(deserializer);
  if (this->deserialize_only == false) {
    context = this->context;
    this_00 = this->catalog;
    info = (CreateFunctionInfo *)
           unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)&local_28);
    Catalog::CreateFunction(this_00,context,info);
    local_20._M_head_impl = local_28._M_head_impl;
  }
  if (local_20._M_head_impl != (CreateInfo *)0x0) {
    (*((local_20._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])(local_20._M_head_impl);
  }
  return;
}

Assistant:

void WriteAheadLogDeserializer::ReplayCreateMacro() {
	auto entry = deserializer.ReadProperty<unique_ptr<CreateInfo>>(101, "macro");
	if (DeserializeOnly()) {
		return;
	}

	catalog.CreateFunction(context, entry->Cast<CreateMacroInfo>());
}